

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O0

int KangarooTwelve(uchar *input,size_t inLen,uchar *output,size_t outLen,uchar *customization,
                  size_t customLen)

{
  int iVar1;
  long in_RCX;
  KangarooTwelve_Instance ktInstance;
  size_t in_stack_fffffffffffffdf8;
  KangarooTwelve_Instance *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  KangarooTwelve_Instance *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe78;
  uchar *in_stack_fffffffffffffe80;
  KangarooTwelve_Instance *in_stack_fffffffffffffe88;
  undefined4 local_4;
  
  if (in_RCX == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = KangarooTwelve_Initialize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (iVar1 == 0) {
      iVar1 = KangarooTwelve_Update
                        (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78);
      if (iVar1 == 0) {
        local_4 = KangarooTwelve_Final
                            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int KangarooTwelve( const unsigned char * input, size_t inLen, unsigned char * output, size_t outLen, const unsigned char * customization, size_t customLen )
{
    KangarooTwelve_Instance ktInstance;

    if (outLen == 0)
        return 1;
    if (KangarooTwelve_Initialize(&ktInstance, outLen) != 0)
        return 1;
    if (KangarooTwelve_Update(&ktInstance, input, inLen) != 0)
        return 1;
    return KangarooTwelve_Final(&ktInstance, output, customization, customLen);
}